

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_window.c
# Opt level: O2

void line_layer_update(ugui_layer_t *layer,void *graphics_ctx,void *layer_ctx)

{
  ushort uVar1;
  ushort uVar2;
  ugui_point_t b;
  ugui_rect_t *puVar3;
  ugui_point_t b_00;
  ugui_point_t b_01;
  ugui_point_t a;
  ugui_point_t a_00;
  
  puVar3 = ugui_layer_get_bounds(layer);
  uVar1 = puVar3->w;
  uVar2 = puVar3->h;
  a = (ugui_point_t)((uVar2 & 0xfffe) * 0x8000);
  b = (ugui_point_t)(uVar1 - 1 & 0xffff);
  b_00 = (ugui_point_t)((int)a + (int)b);
  ugui_graphics_draw_line((ugui_graphics_t *)graphics_ctx,a,b_00);
  a_00.y = 0;
  a_00.x = uVar1 >> 1;
  b_01 = (ugui_point_t)((uint)uVar2 * 0x10000 + (int)a_00 + -0x10000);
  ugui_graphics_draw_line((ugui_graphics_t *)graphics_ctx,a_00,b_01);
  ugui_graphics_draw_line((ugui_graphics_t *)graphics_ctx,(ugui_point_t)0x0,b_00);
  ugui_graphics_draw_line
            ((ugui_graphics_t *)graphics_ctx,(ugui_point_t)((uint)uVar2 * 0x10000 + -0x10000),b_00);
  ugui_graphics_draw_line((ugui_graphics_t *)graphics_ctx,(ugui_point_t)0x0,b_01);
  ugui_graphics_draw_line((ugui_graphics_t *)graphics_ctx,b_01,b);
  ugui_graphics_draw_text
            ((ugui_graphics_t *)graphics_ctx,"test",&font_robotomono_regular_18,
             (ugui_point_t)((uint)a_00 | (uint)a));
  ugui_layer_set_dirty(layer);
  return;
}

Assistant:

static void line_layer_update(ugui_layer_t* layer, void* graphics_ctx, void* layer_ctx)
{
	ugui_rect_t* bounds = ugui_layer_get_bounds(layer);

	int w = bounds->w;
	int h = bounds->h;

	//Horizontal
	ugui_graphics_draw_line(graphics_ctx, (ugui_point_t) {
		.x = 0, .y = h / 2
	}, (ugui_point_t) {
		.x = w - 1, .y = h / 2
	});

	//Vertical
	ugui_graphics_draw_line(graphics_ctx, (ugui_point_t) {
		.x = w / 2, .y = 0
	}, (ugui_point_t) {
		.x = w / 2, .y = h - 1
	});

	//Diagonal gentle down
	ugui_graphics_draw_line(graphics_ctx, (ugui_point_t) {
		.x = 0, .y = 0
	}, (ugui_point_t) {
		.x = w - 1, .y = h / 2
	});

	//Diagonal gentle up
	ugui_graphics_draw_line(graphics_ctx, (ugui_point_t) {
		.x = 0, .y = h - 1
	}, (ugui_point_t) {
		.x = w - 1, .y = h / 2
	});

	//Diagonal sharp down
	ugui_graphics_draw_line(graphics_ctx, (ugui_point_t) {
		.x = 0, .y = 0
	}, (ugui_point_t) {
		.x = w / 2, .y = h - 1
	});

	//Diagonal sharp up
	ugui_graphics_draw_line(graphics_ctx, (ugui_point_t) {
		.x = w / 2, .y = h - 1
	}, (ugui_point_t) {
		.x = w - 1, .y = 0
	});

	ugui_graphics_draw_text(graphics_ctx,
	                        "test",
	                        &font_robotomono_regular_18,
	(ugui_point_t) {
		.x = w / 2, .y = h / 2
	});

	ugui_layer_set_dirty(layer);
}